

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitTableFill
          (Flow *__return_storage_ptr__,
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this,TableFill *curr)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  undefined1 local_148 [8];
  TableInstanceInfo info;
  Literal value;
  Flow destFlow;
  Flow valueFlow;
  Flow sizeFlow;
  
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
            ((Flow *)&value.type,
             &this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>,
             *(Expression **)(curr + 0x20));
  if (destFlow.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
              ((Flow *)&destFlow.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>,
               *(Expression **)(curr + 0x28));
    if (valueFlow.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                ((Flow *)&valueFlow.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>,
                 *(Expression **)(curr + 0x30));
      if (sizeFlow.breakTo.super_IString.str._M_len == 0) {
        getTableInstanceInfo
                  ((TableInstanceInfo *)local_148,this,(Name)*(string_view *)(curr + 0x10));
        if (((long)((long)destFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   destFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id)
            >> 3) * -0x5555555555555555 + value.type.id != 1) {
LAB_00138dd0:
          __assert_fail("values.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                        ,0x52,"const Literal &wasm::Flow::getSingleValue()");
        }
        lVar2 = wasm::Literal::getUnsigned();
        if (destFlow.breakTo.super_IString.str._M_str +
            ((long)((long)valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id)
            >> 3) * -0x5555555555555555 != (char *)0x1) goto LAB_00138dd0;
        wasm::Literal::Literal((Literal *)&info.name.super_IString.str._M_str,(Literal *)&valueFlow)
        ;
        if (valueFlow.breakTo.super_IString.str._M_str +
            ((long)((long)sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id)
            >> 3) * -0x5555555555555555 != (char *)0x1) goto LAB_00138dd0;
        lVar3 = wasm::Literal::getUnsigned();
        sizeFlow.breakTo.super_IString.str._M_str = (char *)local_148;
        uVar1 = (*((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)local_148)->
                  externalInterface->_vptr_ExternalInterface[0x1b])();
        if ((ulong)uVar1 < (ulong)(lVar3 + lVar2)) {
          (*(this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>).
            _vptr_ExpressionRunner[2])(this,"out of bounds table access");
        }
        if (lVar3 != 0) {
          do {
            (**(code **)(**(long **)(sizeFlow.breakTo.super_IString.str._M_str + 0x200) + 0xe0))
                      (*(long **)(sizeFlow.breakTo.super_IString.str._M_str + 0x200),info.instance,
                       info.name.super_IString.str._M_len,lVar2,&info.name.super_IString.str._M_str)
            ;
            lVar2 = lVar2 + 1;
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
        }
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.func.super_IString.str._M_str = (char *)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        type.id = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.i64 = 0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        wasm::Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
      }
      else {
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)valueFlow.breakTo.super_IString.str._M_str;
        wasm::Literal::Literal
                  ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                   _M_elems,(Literal *)&sizeFlow);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
                      id;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish =
             sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len =
             (size_t)sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str =
             (char *)sizeFlow.breakTo.super_IString.str._M_len;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      wasm::Literal::~Literal((Literal *)&sizeFlow);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)destFlow.breakTo.super_IString.str._M_str;
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&valueFlow);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
      ;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)valueFlow.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&valueFlow);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = value.type.id
    ;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&destFlow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)destFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         destFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         destFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    destFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    destFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    destFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)destFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)destFlow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &destFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&destFlow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableFill(TableFill* curr) {
    NOTE_ENTER("TableFill");
    Flow destFlow = self()->visit(curr->dest);
    if (destFlow.breaking()) {
      return destFlow;
    }
    Flow valueFlow = self()->visit(curr->value);
    if (valueFlow.breaking()) {
      return valueFlow;
    }
    Flow sizeFlow = self()->visit(curr->size);
    if (sizeFlow.breaking()) {
      return sizeFlow;
    }
    auto info = getTableInstanceInfo(curr->table);

    auto dest = destFlow.getSingleValue().getUnsigned();
    Literal value = valueFlow.getSingleValue();
    auto size = sizeFlow.getSingleValue().getUnsigned();

    auto tableSize = info.interface()->tableSize(info.name);
    if (dest + size > tableSize) {
      trap("out of bounds table access");
    }

    for (uint64_t i = 0; i < size; i++) {
      info.interface()->tableStore(info.name, dest + i, value);
    }
    return Flow();
  }